

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O3

void sec_flush_all_locked(tsdn_t *tsdn,sec_t *sec,sec_shard_t *shard)

{
  sec_bin_t *psVar1;
  edata_list_active_t eVar2;
  long lVar3;
  edata_t *peVar4;
  anon_struct_8_1_803fbc3e_for_head aVar5;
  ulong uVar6;
  pszind_t pVar7;
  _Bool deferred_work_generated;
  edata_list_active_t to_flush;
  _Bool local_9;
  edata_list_active_t local_8;
  
  shard->bytes_cur = 0;
  local_8.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
  pVar7 = sec->npsizes;
  if (pVar7 != 0) {
    lVar3 = 0x10;
    peVar4 = (edata_t *)0x0;
    uVar6 = 0;
    do {
      psVar1 = shard->bins;
      *(undefined8 *)((long)psVar1 + lVar3 + -8) = 0;
      aVar5.qlh_first = *(edata_t **)(&psVar1->being_batch_filled + lVar3);
      eVar2.head.qlh_first =
           (anon_struct_8_1_803fbc3e_for_head)(anon_struct_8_1_803fbc3e_for_head)aVar5.qlh_first;
      if (peVar4 == (edata_t *)0x0) {
LAB_01c6012f:
        local_8.head.qlh_first = eVar2.head.qlh_first;
        *(undefined8 *)(&psVar1->being_batch_filled + lVar3) = 0;
        peVar4 = aVar5.qlh_first;
      }
      else if (aVar5.qlh_first != (edata_t *)0x0) {
        ((((aVar5.qlh_first)->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
             (peVar4->field_5).ql_link_active.qre_prev;
        (peVar4->field_5).ql_link_active.qre_prev =
             *(edata_t **)(*(long *)(&psVar1->being_batch_filled + lVar3) + 0x30);
        *(undefined8 *)(*(long *)(&psVar1->being_batch_filled + lVar3) + 0x30) =
             *(undefined8 *)
              (*(long *)(*(long *)(&psVar1->being_batch_filled + lVar3) + 0x30) + 0x28);
        (((peVar4->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar4;
        *(long *)(*(long *)(*(long *)(&psVar1->being_batch_filled + lVar3) + 0x30) + 0x28) =
             *(long *)(&psVar1->being_batch_filled + lVar3);
        pVar7 = sec->npsizes;
        aVar5.qlh_first = peVar4;
        eVar2.head.qlh_first = local_8.head.qlh_first;
        goto LAB_01c6012f;
      }
      uVar6 = uVar6 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar6 < pVar7);
  }
  local_9 = false;
  (*sec->fallback->dalloc_batch)(tsdn,sec->fallback,&local_8,&local_9);
  return;
}

Assistant:

static void
sec_flush_all_locked(tsdn_t *tsdn, sec_t *sec, sec_shard_t *shard) {
	malloc_mutex_assert_owner(tsdn, &shard->mtx);
	shard->bytes_cur = 0;
	edata_list_active_t to_flush;
	edata_list_active_init(&to_flush);
	for (pszind_t i = 0; i < sec->npsizes; i++) {
		sec_bin_t *bin = &shard->bins[i];
		bin->bytes_cur = 0;
		edata_list_active_concat(&to_flush, &bin->freelist);
	}

	/*
	 * Ordinarily we would try to avoid doing the batch deallocation while
	 * holding the shard mutex, but the flush_all pathways only happen when
	 * we're disabling the HPA or resetting the arena, both of which are
	 * rare pathways.
	 */
	bool deferred_work_generated = false;
	pai_dalloc_batch(tsdn, sec->fallback, &to_flush,
	    &deferred_work_generated);
}